

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-priority.c
# Opt level: O2

int run_test_process_priority(void)

{
  int iVar1;
  uv_pid_t pid;
  int iVar2;
  char *pcVar3;
  undefined8 uStack_30;
  int r;
  int priority;
  
  r = uv_os_getpriority(0,(int *)0x0);
  if (r == -0x16) {
    for (iVar2 = -0x14; iVar2 != 0x14; iVar2 = iVar2 + 1) {
      r = uv_os_setpriority(0,iVar2);
      if (r != -0xd) {
        if (r != 0) {
          pcVar3 = "r == 0";
          uStack_30 = 0x31;
          goto LAB_0014255e;
        }
        iVar1 = uv_os_getpriority(0,&priority);
        if (iVar1 != 0) {
          pcVar3 = "uv_os_getpriority(0, &priority) == 0";
          uStack_30 = 0x32;
          goto LAB_0014255e;
        }
        if (iVar2 != priority) {
          pcVar3 = "priority == i";
          uStack_30 = 0x37;
          goto LAB_0014255e;
        }
        pid = uv_os_getpid();
        iVar1 = uv_os_getpriority(pid,&r);
        if (iVar1 != 0) {
          pcVar3 = "uv_os_getpriority(uv_os_getpid(), &r) == 0";
          uStack_30 = 0x4a;
          goto LAB_0014255e;
        }
        if (priority != r) {
          pcVar3 = "priority == r";
          uStack_30 = 0x4b;
          goto LAB_0014255e;
        }
      }
    }
    iVar2 = uv_os_setpriority(0,-0x15);
    if (iVar2 == -0x16) {
      iVar2 = uv_os_setpriority(0,0x14);
      if (iVar2 == -0x16) {
        return 0;
      }
      pcVar3 = "uv_os_setpriority(0, UV_PRIORITY_LOW + 1) == UV_EINVAL";
      uStack_30 = 0x50;
    }
    else {
      pcVar3 = "uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1) == UV_EINVAL";
      uStack_30 = 0x4f;
    }
  }
  else {
    pcVar3 = "r == UV_EINVAL";
    uStack_30 = 0x26;
  }
LAB_0014255e:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(process_priority) {
  int priority;
  int r;
  int i;

#if defined(__MVS__)
  if (uv_os_setpriority(0, 0) == UV_ENOSYS)
    RETURN_SKIP("functionality not supported on zOS");
#endif

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  r = uv_os_getpriority(0, NULL);
  ASSERT(r == UV_EINVAL);

  /* Verify that all valid values work. */
  for (i = UV_PRIORITY_HIGHEST; i <= UV_PRIORITY_LOW; i++) {
    r = uv_os_setpriority(0, i);

    /* If UV_EACCES is returned, the current user doesn't have permission to
       set this specific priority. */
    if (r == UV_EACCES)
      continue;

    ASSERT(r == 0);
    ASSERT(uv_os_getpriority(0, &priority) == 0);

    /* Verify that the priority values match on Unix, and are range mapped
       on Windows. */
#ifndef _WIN32
    ASSERT(priority == i);
#else
    /* On Windows, only elevated users can set UV_PRIORITY_HIGHEST. Other
       users will silently be set to UV_PRIORITY_HIGH. */
    if (i < UV_PRIORITY_HIGH)
      ASSERT(priority == UV_PRIORITY_HIGHEST || priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_ABOVE_NORMAL)
      ASSERT(priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_NORMAL)
      ASSERT(priority == UV_PRIORITY_ABOVE_NORMAL);
    else if (i < UV_PRIORITY_BELOW_NORMAL)
      ASSERT(priority == UV_PRIORITY_NORMAL);
    else if (i < UV_PRIORITY_LOW)
      ASSERT(priority == UV_PRIORITY_BELOW_NORMAL);
    else
      ASSERT(priority == UV_PRIORITY_LOW);
#endif

    /* Verify that the current PID and 0 are equivalent. */
    ASSERT(uv_os_getpriority(uv_os_getpid(), &r) == 0);
    ASSERT(priority == r);
  }

  /* Verify that invalid priorities return UV_EINVAL. */
  ASSERT(uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1) == UV_EINVAL);
  ASSERT(uv_os_setpriority(0, UV_PRIORITY_LOW + 1) == UV_EINVAL);

  return 0;
}